

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_push.c
# Opt level: O1

ssize_t mpt_array_push(mpt_encode_array *arr,size_t len,void *data)

{
  size_t *psVar1;
  mpt_buffer *pmVar2;
  void *__dest;
  ulong uVar3;
  int type;
  iovec *piVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  iovec dest;
  iovec src;
  ulong uVar11;
  ulong local_68;
  void *local_60;
  iovec local_50;
  iovec local_40;
  
  if (arr->_enc == (mpt_data_encoder_t)0x0) {
    if (len == 0) {
      psVar1 = &(arr->_state).done;
      *psVar1 = *psVar1 + (arr->_state).scratch;
      (arr->_state).scratch = 0;
      uVar10 = 0;
    }
    else if (data == (void *)0x0) {
      uVar10 = 0xfffffffffffffff0;
    }
    else {
      pmVar2 = (arr->_d)._buf;
      if ((pmVar2 == (mpt_buffer *)0x0) ||
         (uVar10 = 0xfffffffffffffffd, pmVar2->_content_traits == (mpt_type_traits *)0x0)) {
        sVar8 = (arr->_state).scratch + (arr->_state).done;
        __dest = mpt_array_insert(&arr->_d,sVar8,len);
        if (__dest == (void *)0x0) {
          uVar10 = 0xffffffffffffffef;
        }
        else {
          pmVar2 = (arr->_d)._buf;
          memcpy(__dest,data,len);
          psVar1 = &(arr->_state).scratch;
          *psVar1 = *psVar1 + len;
          pmVar2->_used = sVar8 + len;
          uVar10 = len;
        }
      }
    }
  }
  else {
    pmVar2 = (arr->_d)._buf;
    lVar5 = (arr->_state).scratch + (arr->_state).done;
    sVar8 = 0x40;
    if (0x40 < len) {
      sVar8 = len;
    }
    if (pmVar2 == (mpt_buffer *)0x0) {
      uVar10 = 0xffffffffffffffff;
      if (lVar5 != 0) {
        return -1;
      }
      pmVar2 = _mpt_buffer_alloc(sVar8,0);
    }
    else {
      uVar10 = 0xfffffffffffffffd;
      if (pmVar2->_content_traits != (mpt_type_traits *)0x0) {
        return -3;
      }
      pmVar2 = (*pmVar2->_vptr->detach)(pmVar2,lVar5 + sVar8);
    }
    if (pmVar2 == (mpt_buffer *)0x0) {
      uVar10 = 0xfffffffffffffffc;
    }
    else {
      (arr->_d)._buf = pmVar2;
      local_68 = 0;
      local_60 = data;
      do {
        lVar5 = pmVar2->_used - ((arr->_state).scratch + (arr->_state).done);
        bVar7 = true;
        if (lVar5 < 0) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          local_50.iov_base = (void *)((long)pmVar2 + lVar5 + 0x20);
          local_50.iov_len = pmVar2->_size - lVar5;
          if (len == 0) {
            piVar4 = (iovec *)0x0;
          }
          else {
            local_40.iov_base = local_60;
            piVar4 = &local_40;
            local_40.iov_len = len;
          }
          uVar3 = (*arr->_enc)(&arr->_state,&local_50,piVar4);
          uVar9 = lVar5 + (arr->_state).done + (arr->_state).scratch;
          uVar11 = pmVar2->_size;
          if (uVar11 < uVar9) {
            type = 1;
            pcVar6 = "invalid encoder data size";
            uVar3 = uVar9;
LAB_00109624:
            bVar7 = true;
            mpt_log((mpt_logger *)0x0,"mpt_array_push",type,"%s: %zi > %zu",pcVar6,uVar3,uVar11);
            (*arr->_enc)(&arr->_state,(iovec *)0x0,(iovec *)0x0);
            uVar10 = 0xfffffffffffffff8;
          }
          else {
            pmVar2->_used = uVar9;
            if (uVar3 == 0xffffffffffffffef) {
              pmVar2 = (*pmVar2->_vptr->detach)(pmVar2,uVar11 + 0x40);
              if (pmVar2 == (mpt_buffer *)0x0) {
                uVar10 = local_68;
                if (local_68 == 0) {
                  uVar10 = 0xffffffffffffffef;
                }
                pmVar2 = (mpt_buffer *)0x0;
              }
              else {
                (arr->_d)._buf = pmVar2;
                bVar7 = false;
              }
            }
            else if ((long)uVar3 < 0) {
              uVar10 = uVar3;
              if (local_68 != 0) {
                uVar10 = local_68;
              }
            }
            else if (local_60 == (void *)0x0 || len == 0) {
              uVar10 = uVar3 + local_68;
            }
            else {
              if (len < uVar3) {
                type = 2;
                pcVar6 = "bad encoder return size";
                uVar11 = len;
                goto LAB_00109624;
              }
              if (len - uVar3 == 0) {
                len = 0;
                uVar10 = uVar3 + local_68;
              }
              else {
                local_60 = (void *)((long)local_60 + uVar3);
                local_68 = local_68 + uVar3;
                bVar7 = false;
                len = len - uVar3;
              }
            }
          }
        }
      } while (!bVar7);
    }
  }
  return uVar10;
}

Assistant:

extern ssize_t mpt_array_push(MPT_STRUCT(encode_array) *arr, size_t len, const void *data)
{
	MPT_STRUCT(buffer) *b;
	ssize_t max, add;
	
	/* fast path for raw data */
	if (!arr->_enc) {
		void *dest;
		if (!len) {
			arr->_state.done += arr->_state.scratch;
			arr->_state.scratch = 0;
			return 0;
		}
		if (!data) {
			return MPT_ERROR(MissingData);
		}
		if ((b = arr->_d._buf)
		    && b->_content_traits) {
			return MPT_ERROR(BadType);
		}
		max = arr->_state.done + arr->_state.scratch;
		if (!(dest = mpt_array_insert(&arr->_d, max, len))) {
			return MPT_ERROR(MissingBuffer);
		}
		b = arr->_d._buf;
		memcpy(dest, data, len);
		arr->_state.scratch += len;
		b->_used = max + len;
		
		return len;
	}
	max = arr->_state.done + arr->_state.scratch;
	add = len > 64 ? len : 64;
	
	/* current buffer data */
	if (!(b = arr->_d._buf)) {
		if (max) {
			return MPT_ERROR(BadArgument);
		}
		/* use initial data size */
		if (!(b = _mpt_buffer_alloc(add, 0))) {
			return MPT_ERROR(BadOperation);
		}
		arr->_d._buf = b;
	}
	else if (b->_content_traits) {
		return MPT_ERROR(BadType);
	}
	else if (!(b = b->_vptr->detach(b, max + add))) {
		return MPT_ERROR(BadOperation);
	}
	else {
		arr->_d._buf = b;
	}
	max = 0;
	
	while (1) {
		struct iovec dest;
		ssize_t cont, off;
		
		off = arr->_state.done + arr->_state.scratch;
		
		if ((off = b->_used - off) < 0) {
			return MPT_ERROR(BadArgument);
		}
		dest.iov_base = ((uint8_t *) (b + 1)) + off;
		dest.iov_len  = b->_size - off;
		
		/* next regular operation */
		if (!len) {
			cont = arr->_enc(&arr->_state, &dest, 0);
		} else {
			struct iovec src;
			src.iov_base = (void *) data;
			src.iov_len  = len;
			cont = arr->_enc(&arr->_state, &dest, &src);
		}
		off += arr->_state.done + arr->_state.scratch;
		
		/* size update */
		if (b->_size < (size_t) off) {
			mpt_log(0, __func__, MPT_LOG(Fatal), "%s: %zi > %zu",
			        MPT_tr("invalid encoder data size"), off, (size_t) b->_size);
			arr->_enc(&arr->_state, 0, 0);
			return MPT_ERROR(BadEncoding);
		}
		b->_used = off;
		
		/* require larger buffer */
		if (cont == MPT_ERROR(MissingBuffer)) {
			if (!(b = b->_vptr->detach(b, b->_size + 64))) {
				return max ? max : MPT_ERROR(MissingBuffer);
			}
			arr->_d._buf = b;
			continue;
		}
		if (cont < 0) {
			return max ? max : cont;
		}
		/* positive no error except for incomplete write */
		if (!data || !len) {
			return max + cont;
		}
		/* space error */
		if (len < (size_t) cont) {
			mpt_log(0, __func__, MPT_LOG(Critical), "%s: %zi > %zu",
			        MPT_tr("bad encoder return size"), cont, len);
			arr->_enc(&arr->_state, 0, 0);
			return MPT_ERROR(BadEncoding);
		}
		/* all data processed */
		if (!(len -= cont)) {
			return max + cont;
		}
		/* advance source data offset */
		data = ((uint8_t *) data) + cont;
		max += cont;
	}
}